

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGetTextureSubImageTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::GetTextureSubImage::Errors::testBufferOrMultisampledTargetError(Errors *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestLog *this_00;
  MessageBuilder *pMVar3;
  char *local_1c8 [3];
  MessageBuilder local_1b0;
  uint local_30;
  int local_2c;
  GLint is_proper_error;
  GLint error_value;
  Functions *gl;
  Errors *this_local;
  
  gl = (Functions *)this;
  pRVar2 = deqp::Context::getRenderContext(this->m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  _is_proper_error = CONCAT44(extraout_var,iVar1);
  (*this->m_gl_GetTextureSubImage)
            (this->m_texture_2D_multisampled,0,0,0,0,2,2,1,0x1908,0x1401,0x10,
             this->m_destination_buffer);
  local_2c = (**(code **)(_is_proper_error + 0x800))();
  local_30 = (uint)(local_2c == 0x502);
  if (local_30 == 0) {
    this_00 = tcu::TestContext::getLog
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1b0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_1b0,
                        (char (*) [173])
                        "GL_INVALID_OPERATION error is expected to be generated by glGetTextureSubImage if texture is the name of multisample texture (OpenGL 4.5 Core Specification chapter 8.11.4)."
                       );
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [27])0x29c4368);
    local_1c8[0] = glu::getErrorName(local_2c);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,local_1c8);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [16])0x29dd1c0);
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b0);
  }
  return local_30 != 0;
}

Assistant:

bool gl4cts::GetTextureSubImage::Errors::testBufferOrMultisampledTargetError()
{
	/* OpenGL functions access point. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Test. */
	m_gl_GetTextureSubImage(m_texture_2D_multisampled, 0, 0, 0, 0, s_texture_data_width, s_texture_data_height, 1,
							GL_RGBA, GL_UNSIGNED_BYTE, s_destination_buffer_size, m_destination_buffer);

	glw::GLint error_value	 = gl.getError();
	glw::GLint is_proper_error = (GL_INVALID_OPERATION == error_value);

	if (!is_proper_error)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "GL_INVALID_OPERATION error is expected to be generated by "
													   "glGetTextureSubImage if texture is the name of multisample "
													   "texture (OpenGL 4.5 Core Specification chapter 8.11.4)."
						   << " However, the error value " << glu::getErrorName(error_value) << " was generated."
						   << tcu::TestLog::EndMessage;
	}

	if (is_proper_error)
	{
		return true;
	}

	return false;
}